

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurCharReader::OurImpl::parse
          (OurImpl *this,char *beginDoc,char *endDoc,Value *root,String *errs)

{
  String local_58;
  byte local_31;
  String *pSStack_30;
  bool ok;
  String *errs_local;
  Value *root_local;
  char *endDoc_local;
  char *beginDoc_local;
  OurImpl *this_local;
  
  pSStack_30 = errs;
  errs_local = (String *)root;
  root_local = (Value *)endDoc;
  endDoc_local = beginDoc;
  beginDoc_local = (char *)this;
  local_31 = OurReader::parse(&this->reader_,beginDoc,endDoc,root,(bool)(this->collectComments_ & 1)
                             );
  if (pSStack_30 != (String *)0x0) {
    OurReader::getFormattedErrorMessages_abi_cxx11_(&local_58,&this->reader_);
    std::__cxx11::string::operator=((string *)pSStack_30,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool parse(char const* beginDoc, char const* endDoc, Value* root,
               String* errs) override {
      bool ok = reader_.parse(beginDoc, endDoc, *root, collectComments_);
      if (errs) {
        *errs = reader_.getFormattedErrorMessages();
      }
      return ok;
    }